

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RSA.h
# Opt level: O0

void __thiscall RSA::encrypt(RSA *this,char *__block,int __edflag)

{
  Conversion *this_00;
  BigInt *num_decimal_base;
  bool bVar1;
  reference pcVar2;
  string *psVar3;
  undefined4 in_register_00000014;
  BigInt local_190;
  undefined1 local_170 [64];
  undefined1 local_130 [8];
  BigInt cipher;
  string local_108 [32];
  undefined1 local_e8 [8];
  BigInt message;
  _Self local_c0;
  _Self local_b8;
  char local_a9;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Stack_a8;
  char plain_char;
  iterator __end1;
  iterator __begin1;
  string *__range1;
  string local_80 [32];
  char *local_60;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_58;
  undefined1 local_50 [8];
  set<char,_std::less<char>,_std::allocator<char>_> vocab_set;
  string *pPlainText_local;
  RSA *this_local;
  
  vocab_set._M_t._M_impl.super__Rb_tree_header._M_node_count =
       CONCAT44(in_register_00000014,__edflag);
  local_58._M_current = (char *)std::__cxx11::string::begin();
  local_60 = (char *)std::__cxx11::string::end();
  std::set<char,std::less<char>,std::allocator<char>>::
  set<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>
            ((set<char,std::less<char>,std::allocator<char>> *)local_50,local_58,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )local_60);
  std::operator+((char *)local_80,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)"_");
  std::__cxx11::string::operator=((string *)(__block + 0x28),local_80);
  std::__cxx11::string::~string(local_80);
  __end1._M_current = (char *)std::__cxx11::string::begin();
  _Stack_a8._M_current = (char *)std::__cxx11::string::end();
  do {
    bVar1 = __gnu_cxx::operator!=(&__end1,&stack0xffffffffffffff58);
    if (!bVar1) {
      this_00 = *(Conversion **)(__block + 0x1a0);
      std::__cxx11::string::string(local_108,(string *)(__block + 0x28));
      Conversion::convert_to_num_base((BigInt *)local_e8,this_00,(string *)local_108);
      std::__cxx11::string::~string(local_108);
      BigInt::operator=((BigInt *)(__block + 0x160),(BigInt *)local_e8);
      bVar1 = BigInt::operator>=((BigInt *)local_e8,(BigInt *)(__block + 0xe0));
      if (bVar1) {
        psVar3 = (string *)
                 std::__cxx11::string::operator=
                           ((string *)(__block + 0x28),"The message is to large to fit into n space"
                           );
        std::__cxx11::string::operator=((string *)(__block + 0x48),psVar3);
        BigInt::operator=((BigInt *)(__block + 0x160),0);
        std::allocator<char>::allocator();
        std::__cxx11::string::string((string *)this,"",(allocator *)&cipher.field_0x1f);
        std::allocator<char>::~allocator((allocator<char> *)&cipher.field_0x1f);
        message.sign = 1;
      }
      else {
        BigInt::BigInt((BigInt *)(local_170 + 0x20),(BigInt *)(__block + 0x120));
        BigInt::powMod((BigInt *)local_130,(BigInt *)local_e8,(BigInt *)(local_170 + 0x20),
                       (BigInt *)(__block + 0xe0));
        BigInt::~BigInt((BigInt *)(local_170 + 0x20));
        BigInt::operator=((BigInt *)(__block + 0x180),(BigInt *)local_130);
        num_decimal_base = *(BigInt **)(__block + 0x1a0);
        BigInt::BigInt(&local_190,(BigInt *)local_130);
        Conversion::convert_to_voacb_base_abi_cxx11_((Conversion *)local_170,num_decimal_base);
        std::__cxx11::string::operator=((string *)(__block + 0x48),(string *)local_170);
        std::__cxx11::string::~string((string *)local_170);
        BigInt::~BigInt(&local_190);
        std::__cxx11::string::string((string *)this,(string *)(__block + 0x48));
        message.sign = 1;
        BigInt::~BigInt((BigInt *)local_130);
      }
      BigInt::~BigInt((BigInt *)local_e8);
LAB_001053c0:
      std::set<char,_std::less<char>,_std::allocator<char>_>::~set
                ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50);
      return;
    }
    pcVar2 = __gnu_cxx::
             __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::operator*(&__end1);
    local_a9 = *pcVar2;
    local_b8._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::find
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50,&local_a9);
    local_c0._M_node =
         (_Base_ptr)
         std::set<char,_std::less<char>,_std::allocator<char>_>::end
                   ((set<char,_std::less<char>,_std::allocator<char>_> *)local_50);
    bVar1 = std::operator==(&local_b8,&local_c0);
    if (bVar1) {
      psVar3 = (string *)
               std::__cxx11::string::operator=
                         ((string *)(__block + 0x28),
                          "Some letter in the plain text is not contained in vocabulary");
      std::__cxx11::string::operator=((string *)(__block + 0x48),psVar3);
      BigInt::operator=((BigInt *)(__block + 0x160),0);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)this,"",(allocator *)&message.field_0x1f);
      std::allocator<char>::~allocator((allocator<char> *)&message.field_0x1f);
      message.sign = 1;
      goto LAB_001053c0;
    }
    __gnu_cxx::
    __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

string RSA::encrypt(string pPlainText) {
    set<char> vocab_set(vocabulary.begin(), vocabulary.end());
    plainText = "_" + pPlainText; //! some character may be zero

    for (auto plain_char:plainText)
        if (vocab_set.find(plain_char) == vocab_set.end()) {
            cipherText = plainText = "Some letter in the plain text is not contained in vocabulary";
            plain_BigInt = 0;
            return "";
        }
    BigInt message = conversion->convert_to_num_base(plainText);

    plain_BigInt = message;

    if (message >= n) {
        cipherText = plainText = "The message is to large to fit into n space";
        plain_BigInt = 0;
        return "";
    }

    BigInt cipher = message.powMod(e, n);
    cipher_BigInt = cipher;
    cipherText = conversion->convert_to_voacb_base(cipher);
    return cipherText;
}